

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

ByteData *
cfd::core::TaprootUtil::CreateTapScriptControl
          (ByteData *__return_storage_ptr__,SchnorrPubkey *internal_pubkey,TapBranch *merkle_tree,
          SchnorrPubkey *witness_program,Script *locking_script)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  ByteData256 *node;
  ByteData256 *buffer;
  bool parity;
  ByteData256 pubkey_data;
  Serializer builder;
  bool local_b1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b0;
  Script local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  Serializer local_58;
  
  local_b1 = false;
  local_b0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)witness_program;
  TapBranch::GetTweakedPubkey((SchnorrPubkey *)&local_a8,merkle_tree,internal_pubkey,&local_b1);
  SchnorrPubkey::GetByteData256((ByteData256 *)&local_70,(SchnorrPubkey *)&local_a8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  bVar2 = local_b1;
  bVar1 = merkle_tree->leaf_version_;
  Serializer::Serializer(&local_58);
  bVar3 = 0xc0;
  if (bVar1 != 0) {
    bVar3 = bVar1;
  }
  Serializer::AddDirectByte(&local_58,bVar3 | bVar2);
  SchnorrPubkey::GetData((ByteData *)&local_a8,internal_pubkey);
  Serializer::AddDirectBytes(&local_58,(ByteData *)&local_a8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  (*merkle_tree->_vptr_TapBranch[4])(&local_a8,merkle_tree);
  for (buffer = (ByteData256 *)local_a8._vptr_Script;
      buffer != (ByteData256 *)
                local_a8.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; buffer = buffer + 1) {
    Serializer::AddDirectBytes(&local_58,buffer);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_a8);
  if (local_b0 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_a8,(ByteData256 *)&local_70);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_b0,&local_a8)
    ;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  }
  if (locking_script != (Script *)0x0) {
    ScriptUtil::CreateTaprootLockingScript(&local_a8,(ByteData256 *)&local_70);
    Script::operator=(locking_script,&local_a8);
    Script::~Script(&local_a8);
  }
  Serializer::Output(__return_storage_ptr__,&local_58);
  Serializer::~Serializer(&local_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

ByteData TaprootUtil::CreateTapScriptControl(
    const SchnorrPubkey& internal_pubkey, const TapBranch& merkle_tree,
    SchnorrPubkey* witness_program, Script* locking_script) {
  bool parity = false;
  auto pubkey_data =
      merkle_tree.GetTweakedPubkey(internal_pubkey, &parity).GetByteData256();
  uint8_t top = merkle_tree.GetLeafVersion();
  if (top == 0) top = TaprootScriptTree::kTapScriptLeafVersion;
  if (parity) top |= 0x01;
  Serializer builder;
  builder.AddDirectByte(top);
  builder.AddDirectBytes(internal_pubkey.GetData());
  for (const auto& node : merkle_tree.GetNodeList()) {
    builder.AddDirectBytes(node);
  }
  if (witness_program != nullptr) {
    *witness_program = SchnorrPubkey(pubkey_data);
  }
  if (locking_script != nullptr) {
    *locking_script = ScriptUtil::CreateTaprootLockingScript(pubkey_data);
  }
  return builder.Output();
}